

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O2

int check_block_sizes(test_state *state,int id,int id_len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar5 = 8;
  do {
    uVar7 = 1;
    if (0x40 < uVar5) {
      return 0;
    }
    state->strm->block_size = uVar5;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(int)uVar5 * (long)state->bytes_per_sample;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = state->buf_len;
    uVar6 = SUB168(auVar2 / auVar1,0) & 0xffffffff;
    if (0xfff < SUB164(auVar2 / auVar1,0)) {
      uVar6 = 0x1000;
    }
    while ((int)uVar7 <= (int)uVar6) {
      state->strm->rsi = uVar7;
      iVar3 = (*state->codec)(state);
      if (iVar3 != 0) {
        return iVar3;
      }
      uVar4 = (uint)(*state->cbuf >> (8U - (char)id_len & 0x1f));
      uVar7 = uVar7 + 1;
      if (uVar4 != id) {
        printf("%s: block of size %i created with ID:%x, expected %x.\n","\x1b[0;31mFAIL\x1b[0m",
               (ulong)uVar5,(ulong)uVar4,id);
        return 99;
      }
    }
    uVar5 = uVar5 * 2;
  } while( true );
}

Assistant:

int check_block_sizes(struct test_state *state, int id, int id_len)
{
    int bs, status, rsi, max_rsi;

    for (bs = 8; bs <= 64; bs *= 2) {
        state->strm->block_size = bs;

        max_rsi = (int)(state->buf_len / (bs * state->bytes_per_sample));
        if (max_rsi > 4096)
            max_rsi = 4096;

        for (rsi = 1; rsi <= max_rsi; rsi++) {
            state->strm->rsi = rsi;
            status = state->codec(state);
            if (status)
                return status;

            if ((state->cbuf[0] >> (8 - id_len)) != id) {
                printf(
                    "%s: block of size %i created with ID:%x, expected %x.\n",
                    CHECK_FAIL, bs, state->cbuf[0] >> (8 - id_len), id
                    );
                return 99;
            }
        }
    }
    return 0;
}